

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O2

aiString * ReadString(aiString *__return_storage_ptr__,StreamReaderLE *stream,uint32_t numWChars)

{
  uint uVar1;
  unsigned_short uVar2;
  int iVar3;
  unsigned_short *start;
  ulong uVar4;
  size_t __n;
  uint32_t n;
  ulong uVar5;
  allocator<char> local_69;
  vector<unsigned_char,_std::allocator<unsigned_char>_> str;
  void *local_48;
  ulong local_40;
  
  if (stream == (StreamReaderLE *)0x0 || numWChars == 0) {
    if (ReadString(Assimp::StreamReader<false,false>*,unsigned_int)::empty == '\0') {
      iVar3 = __cxa_guard_acquire(&ReadString(Assimp::StreamReader<false,false>*,unsigned_int)::
                                   empty);
      if (iVar3 != 0) {
        ReadString::empty.length = 0;
        ReadString::empty.data[0] = '\0';
        memset(ReadString::empty.data + 1,0x1b,0x3ff);
        __cxa_guard_release(&ReadString(Assimp::StreamReader<false,false>*,unsigned_int)::empty);
      }
    }
    uVar1 = 0x3ff;
    if (ReadString::empty.length < 0x3ff) {
      uVar1 = ReadString::empty.length;
    }
    __return_storage_ptr__->length = uVar1;
    memcpy(__return_storage_ptr__->data,ReadString::empty.data,(ulong)uVar1);
    __return_storage_ptr__->data[uVar1] = '\0';
  }
  else {
    str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&str,(ulong)(numWChars * 4 + 1));
    uVar4 = (ulong)numWChars;
    start = (unsigned_short *)operator_new__(uVar4 * 2);
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      uVar2 = Assimp::StreamReader<false,_false>::Get<unsigned_short>(stream);
      start[uVar5] = uVar2;
    }
    utf8::
    utf16to8<unsigned_short_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (start,start + uVar4,&str);
    str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               (char *)str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start,&local_69);
    __n = 0x3ff;
    if ((local_40 & 0xfffffc00) == 0) {
      __n = local_40 & 0xffffffff;
    }
    __return_storage_ptr__->length = (ai_uint32)__n;
    memcpy(__return_storage_ptr__->data,local_48,__n);
    __return_storage_ptr__->data[__n] = '\0';
    std::__cxx11::string::~string((string *)&local_48);
    operator_delete__(start);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

static aiString ReadString(StreamReaderLE *stream, uint32_t numWChars) {
    if ( nullptr == stream || 0 == numWChars ) {
        static const aiString empty;
        return empty;
    }

    // Allocate buffers (max expansion is 1 byte -> 4 bytes for UTF-8)
    std::vector<unsigned char> str;
    str.reserve( numWChars * 4 + 1 );
    uint16_t *temp = new uint16_t[ numWChars ];
    for ( uint32_t n = 0; n < numWChars; ++n ) {
        temp[ n ] = stream->GetU2();
    }

    // Convert it and NUL-terminate.
    const uint16_t *start( temp ), *end( temp + numWChars );
    utf8::utf16to8( start, end, back_inserter( str ) );
    str[ str.size() - 1 ] = '\0';

    // Return the final string.
    aiString result = aiString((const char *)&str[0]);
    delete[] temp;

    return result;
}